

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void partial_suite::parse_nested_array(void)

{
  bool v;
  reader *reader_00;
  basic_variable<std::allocator<char>_> *local_3b0;
  undefined4 local_3a0;
  value local_39c [2];
  undefined4 local_394;
  value local_390 [2];
  iterator local_388;
  iterator local_370;
  iterator local_358;
  iterator local_340;
  nullable local_324;
  basic_variable<std::allocator<char>_> *local_320;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> local_2b8;
  basic_variable<std::allocator<char>_> local_288;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_228 [24];
  variable expect;
  basic_variable<std::allocator<char>_> result;
  undefined4 local_1b0;
  value local_1ac [2];
  undefined4 local_1a4;
  value local_1a0 [2];
  view_type local_198;
  undefined1 local_188 [8];
  reader reader;
  allocator<char> local_29;
  string local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,"[[null,true,2,3.0,\"alpha\"]]",&local_29);
  std::allocator<char>::~allocator(&local_29);
  local_198 = (view_type)std::__cxx11::string::operator_cast_to_basic_string_view(local_28);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_188,&local_198);
  local_1a0[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_188);
  local_1a4 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","json::token::symbol::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1d1,"void partial_suite::parse_nested_array()",local_1a0,&local_1a4);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_188);
  local_1ac[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_188);
  local_1b0 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","json::token::symbol::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1d3,"void partial_suite::parse_nested_array()",local_1ac,&local_1b0);
  trial::protocol::json::partial::parse<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28,
             (partial *)local_188,reader_00);
  v = trial::dynamic::basic_variable<std::allocator<char>>::
      is<trial::dynamic::basic_array<std::allocator<char>>>
                ((basic_variable<std::allocator<char>> *)&expect.storage.field_0x28);
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1d6,"void partial_suite::parse_nested_array()",v);
  local_320 = &local_318;
  local_324 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,&local_324);
  local_320 = &local_2e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_320,true);
  local_320 = &local_2b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_320,2);
  local_320 = &local_288;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_320,3.0);
  local_320 = &local_258;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,"alpha");
  local_228._0_8_ = &local_318;
  local_228._8_8_ = 5;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_228 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_228);
  local_3b0 = (basic_variable<std::allocator<char>_> *)local_228;
  do {
    local_3b0 = local_3b0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3b0);
  } while (local_3b0 != &local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_340,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_358,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_370,(basic_variable<std::allocator<char>_> *)(local_228 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_388,(basic_variable<std::allocator<char>_> *)(local_228 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1db,"void partial_suite::parse_nested_array()",&local_340,&local_358,&local_370,
             &local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_340);
  local_390[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_188);
  local_394 = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","json::token::symbol::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1dd,"void partial_suite::parse_nested_array()",local_390,&local_394);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_188);
  local_39c[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_188);
  local_3a0 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","json::token::symbol::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1df,"void partial_suite::parse_nested_array()",local_39c,&local_3a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_228 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_188);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void parse_nested_array()
{
    std::string input = "[[null,true,2,3.0,\"alpha\"]]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), json::token::symbol::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), json::token::symbol::begin_array);

    auto result = json::partial::parse(reader);
    TRIAL_PROTOCOL_TEST(result.is<array>());

    variable expect = { null, true, 2, 3.0, "alpha" };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());

    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), json::token::symbol::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), json::token::symbol::end);
}